

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O2

void __thiscall
LASquadtree::intersect_tile_with_cells_adaptive
          (LASquadtree *this,F32 ll_x,F32 ll_y,F32 ur_x,F32 ur_y,F32 cell_min_x,F32 cell_max_x,
          F32 cell_min_y,F32 cell_max_y,U32 level,U32 level_index)

{
  U32 level_index_00;
  U32 level_index_01;
  U32 level_00;
  F32 cell_max_x_00;
  float cell_max_y_00;
  float cell_max_x_01;
  F32 cell_max_y_01;
  float cell_mid_y;
  float cell_mid_x;
  U32 local_1c;
  
  local_1c = get_cell_index(this,level_index,level);
  if ((this->levels <= level) || ((this->adaptive[local_1c >> 5] >> (local_1c & 0x1f) & 1) == 0)) {
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)this->current_cells,(int *)&local_1c);
    return;
  }
  level_00 = level + 1;
  level_index_01 = level_index << 2;
  cell_max_x_00 = (F32)(((float)cell_min_x + (float)cell_max_x) * 0.5);
  cell_max_y_00 = ((float)cell_min_y + (float)cell_max_y) * 0.5;
  if ((float)ur_x <= (float)cell_max_x_00) {
    if (cell_max_y_00 < (float)ur_y) {
      if (cell_max_y_00 <= (float)ll_y) {
        level_index_01 = level_index_01 | 2;
        cell_min_y = (F32)cell_max_y_00;
        cell_max_y_00 = (float)cell_max_y;
      }
      else {
        intersect_tile_with_cells_adaptive
                  (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,cell_max_x_00,cell_min_y,(F32)cell_max_y_00,
                   level_00,level_index_01);
        level_index_01 = level_index_01 | 2;
        cell_min_y = (F32)cell_max_y_00;
        cell_max_y_00 = (float)cell_max_y;
      }
    }
    goto LAB_0012720a;
  }
  if ((float)cell_max_x_00 <= (float)ll_x) {
    if ((float)ur_y <= cell_max_y_00) {
      level_index_01 = level_index_01 | 1;
      cell_min_x = cell_max_x_00;
      cell_max_x_00 = cell_max_x;
      goto LAB_0012720a;
    }
    if (cell_max_y_00 <= (float)ll_y) {
      level_index_01 = level_index_01 | 3;
      cell_min_x = cell_max_x_00;
      cell_max_x_00 = cell_max_x;
      cell_min_y = (F32)cell_max_y_00;
      cell_max_y_00 = (float)cell_max_y;
      goto LAB_0012720a;
    }
    level_index_00 = level_index_01 | 1;
    cell_min_x = cell_max_x_00;
    cell_max_x_01 = (float)cell_max_x;
    cell_max_y_01 = (F32)cell_max_y_00;
  }
  else {
    if ((float)ur_y <= cell_max_y_00) {
      intersect_tile_with_cells_adaptive
                (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,cell_max_x_00,cell_min_y,(F32)cell_max_y_00,
                 level_00,level_index_01);
      level_index_01 = level_index_01 | 1;
      cell_min_x = cell_max_x_00;
      cell_max_x_00 = cell_max_x;
      goto LAB_0012720a;
    }
    if ((float)ll_y < cell_max_y_00) {
      intersect_tile_with_cells_adaptive
                (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,cell_max_x_00,cell_min_y,(F32)cell_max_y_00,
                 level_00,level_index_01);
      intersect_tile_with_cells_adaptive
                (this,ll_x,ll_y,ur_x,ur_y,cell_max_x_00,cell_max_x,cell_min_y,(F32)cell_max_y_00,
                 level_00,level_index_01 | 1);
    }
    level_index_00 = level_index_01 | 2;
    cell_max_x_01 = (float)cell_max_x_00;
    cell_min_y = (F32)cell_max_y_00;
    cell_max_y_01 = cell_max_y;
  }
  intersect_tile_with_cells_adaptive
            (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,(F32)cell_max_x_01,cell_min_y,cell_max_y_01,
             level_00,level_index_00);
  level_index_01 = level_index_01 | 3;
  cell_min_x = cell_max_x_00;
  cell_max_x_00 = cell_max_x;
  cell_min_y = (F32)cell_max_y_00;
  cell_max_y_00 = (float)cell_max_y;
LAB_0012720a:
  intersect_tile_with_cells_adaptive
            (this,ll_x,ll_y,ur_x,ur_y,cell_min_x,cell_max_x_00,cell_min_y,(F32)cell_max_y_00,
             level_00,level_index_01);
  return;
}

Assistant:

void LASquadtree::intersect_tile_with_cells_adaptive(const F32 ll_x, const F32 ll_y, const F32 ur_x, const F32 ur_y, const F32 cell_min_x, const F32 cell_max_x, const F32 cell_min_y, const F32 cell_max_y, U32 level, U32 level_index)
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  U32 cell_index = get_cell_index(level_index, level);
  U32 adaptive_pos = cell_index/32;
  U32 adaptive_bit = ((U32)1) << (cell_index%32);
  if ((level < levels) && (adaptive[adaptive_pos] & adaptive_bit))
  {
    level++;
    level_index <<= 2;

    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;

    if (ur_x <= cell_mid_x)
    {
      // cell_max_x = cell_mid_x;
      if (ur_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
      }
      else if (!(ll_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
      else
      {
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
    }
    else if (!(ll_x < cell_mid_x))
    {
      // cell_min_x = cell_mid_x;
      // level_index |= 1;
      if (ur_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(ll_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
    else
    {
      if (ur_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(ll_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_tile_with_cells_adaptive(ll_x, ll_y, ur_x, ur_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
  }
  else
  {
    ((my_cell_vector*)current_cells)->push_back(cell_index);
  }
}